

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O2

void __thiscall
agge::tests::LayoutTests::MultiLineUnboundLayoutProducesGlyphRunsForEachLineUTF8(LayoutTests *this)

{
  undefined8 uVar1;
  long lVar2;
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  _Var3;
  undefined8 *puVar4;
  undefined1 *puVar5;
  positioned_glyph *ppVar6;
  byte bVar7;
  allocator local_5c1;
  factory_ptr f2;
  factory_ptr f1;
  LocationInfo local_5a0;
  ref_text_line local_578;
  ref_text_line local_550;
  ref_text_line local_528;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_500;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_4f0;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_4e0;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_4d0;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_4c0;
  _Vector_base<agge::text_line,_std::allocator<agge::text_line>_> local_4b0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_498;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_480;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_468;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_450;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_438;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_420;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_408;
  string local_3f0;
  ref_glyph_run local_3d0;
  undefined1 local_398 [56];
  undefined1 local_360 [56];
  positioned_glyph reference12 [7];
  positioned_glyph reference22 [4];
  positioned_glyph reference23 [7];
  positioned_glyph reference21 [5];
  positioned_glyph reference11 [10];
  layout l2;
  layout l1;
  char_to_index indices [4];
  _Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> local_b8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  bVar7 = 0;
  indices[2].symbol = 0x42;
  indices[2].index = 2;
  indices[3].symbol = 0xe0;
  indices[3].index = 3;
  indices[0].symbol = 0x20;
  indices[0].index = 0;
  indices[1].symbol = 0x2713;
  indices[1].index = 1;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x401c666666666666;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = 0;
  uStack_98 = 0;
  local_90 = 0x4026000000000000;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0x402a000000000000;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0x4031000000000000;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)&f1,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm1,(glyph (*) [4])indices);
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)&f2,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm2,(glyph (*) [4])indices);
  layout::layout(&l1);
  layout::layout(&l2);
  std::__cxx11::string::string((string *)reference12,anon_var_dwarf_90fd5,(allocator *)reference23);
  R((richtext_t *)reference11,(string *)reference12);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&l1,reference11,
             f1.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string
            ((annotated_string<char,_agge::font_style_annotation> *)reference11);
  std::__cxx11::string::~string((string *)reference12);
  std::__cxx11::string::string((string *)reference12,anon_var_dwarf_90fef,(allocator *)reference23);
  R((richtext_t *)reference11,(string *)reference12);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&l2,reference11,
             f2.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string
            ((annotated_string<char,_agge::font_style_annotation> *)reference11);
  std::__cxx11::string::~string((string *)reference12);
  puVar4 = &DAT_001a4640;
  ppVar6 = reference11;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *puVar4;
    ppVar6->index = (int)uVar1;
    (ppVar6->d).dx = (float)(int)((ulong)uVar1 >> 0x20);
    puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    ppVar6 = (positioned_glyph *)((long)ppVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  puVar5 = &DAT_001a4730;
  ppVar6 = reference12;
  for (_Var3._M_current = (text_line *)0x54; _Var3._M_current != (text_line *)0x0;
      _Var3._M_current = (text_line *)((long)&_Var3._M_current[-1].descent + 3)) {
    *(undefined1 *)&ppVar6->index = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    ppVar6 = (positioned_glyph *)((long)ppVar6 + (ulong)bVar7 * -2 + 1);
  }
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4c0,
             &((f1.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  ref_glyph_run::ref_glyph_run<10ul>
            ((ref_glyph_run *)reference23,(shared_ptr<agge::font> *)&local_4c0,0.0,0.0,&reference11)
  ;
  plural_::operator+((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>
                      *)&local_550,(plural_ *)&plural,(ref_glyph_run *)reference23);
  ref_text_line::ref_text_line
            ((ref_text_line *)local_360,0.0,10.0,120.2,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_550);
  plural_::operator+(&local_408,(plural_ *)&plural,(ref_text_line *)local_360);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4d0,
             &((f1.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  ref_glyph_run::ref_glyph_run<7ul>
            ((ref_glyph_run *)reference21,(shared_ptr<agge::font> *)&local_4d0,0.0,0.0,&reference12)
  ;
  plural_::operator+((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>
                      *)&local_578,(plural_ *)&plural,(ref_glyph_run *)reference21);
  ref_text_line::ref_text_line
            ((ref_text_line *)local_398,0.0,24.0,87.1,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_578);
  tests::operator+((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>
                    *)&local_528,&local_408,(ref_text_line *)local_398);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_5a0,
             (tests *)l1._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )l1._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
               _M_impl.super__Vector_impl_data._M_finish,_Var3);
  std::__cxx11::string::string
            ((string *)reference22,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,(allocator *)&local_3f0);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_3d0,(string *)reference22,0x12f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_528,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_5a0,
             (LocationInfo *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)reference22);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base
            ((_Vector_base<agge::text_line,_std::allocator<agge::text_line>_> *)&local_5a0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_528);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             (local_398 + 0x10));
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_578);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)reference21);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4d0._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_408);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             (local_360 + 0x10));
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_550);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)reference23);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4c0._M_refcount);
  reference21[4].index = 2;
  reference21[4].d.dx = 13.0;
  reference21[4].d.dy = 0.0;
  reference21[2].d.dy = 0.0;
  reference21[3].index = 3;
  reference21[3].d.dx = 17.0;
  reference21[3].d.dy = 0.0;
  reference21[1].d.dx = 17.0;
  reference21[1].d.dy = 0.0;
  reference21[2].index = 0;
  reference21[2].d.dx = 7.1;
  reference21[0].index = 1;
  reference21[0].d.dx = 11.0;
  reference21[0].d.dy = 0.0;
  reference21[1].index = 3;
  reference22[2].d.dy = 0.0;
  reference22[3].index = 2;
  reference22[3].d.dx = 13.0;
  reference22[3].d.dy = 0.0;
  reference22[1].d.dx = 7.1;
  reference22[1].d.dy = 0.0;
  reference22[2].index = 1;
  reference22[2].d.dx = 11.0;
  reference22[0].index = 1;
  reference22[0].d.dx = 11.0;
  reference22[0].d.dy = 0.0;
  reference22[1].index = 0;
  puVar5 = &DAT_001a4730;
  ppVar6 = reference23;
  for (_Var3._M_current = (text_line *)0x54; _Var3._M_current != (text_line *)0x0;
      _Var3._M_current = (text_line *)((long)&_Var3._M_current[-1].descent + 3)) {
    *(undefined1 *)&ppVar6->index = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    ppVar6 = (positioned_glyph *)((long)ppVar6 + (ulong)bVar7 * -2 + 1);
  }
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4e0,
             &((f2.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  ref_glyph_run::ref_glyph_run<5ul>
            ((ref_glyph_run *)local_360,(shared_ptr<agge::font> *)&local_4e0,0.0,0.0,&reference21);
  plural_::operator+(&local_468,(plural_ *)&plural,(ref_glyph_run *)local_360);
  ref_text_line::ref_text_line(&local_528,0.0,14.0,65.1,&local_468);
  plural_::operator+(&local_450,(plural_ *)&plural,&local_528);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4f0,
             &((f2.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  ref_glyph_run::ref_glyph_run<4ul>
            ((ref_glyph_run *)local_398,(shared_ptr<agge::font> *)&local_4f0,0.0,0.0,&reference22);
  plural_::operator+(&local_480,(plural_ *)&plural,(ref_glyph_run *)local_398);
  ref_text_line::ref_text_line(&local_550,0.0,32.0,42.1,&local_480);
  tests::operator+(&local_438,&local_450,&local_550);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_500,
             &((f2.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  ref_glyph_run::ref_glyph_run<7ul>
            (&local_3d0,(shared_ptr<agge::font> *)&local_500,0.0,0.0,&reference23);
  plural_::operator+(&local_498,(plural_ *)&plural,&local_3d0);
  ref_text_line::ref_text_line(&local_578,0.0,50.0,87.1,&local_498);
  tests::operator+(&local_420,&local_438,&local_578);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_4b0,
             (tests *)l2._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )l2._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
               _M_impl.super__Vector_impl_data._M_finish,_Var3);
  std::__cxx11::string::string
            ((string *)&local_3f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_5c1);
  ut::LocationInfo::LocationInfo(&local_5a0,&local_3f0,0x141);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_420,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_4b0,
             &local_5a0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_4b0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_420);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_578._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_498);
  ref_glyph_run::~ref_glyph_run(&local_3d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_500._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_438);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_550._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_480);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)local_398);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4f0._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_450);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_528._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_468);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)local_360);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4e0._M_refcount);
  layout::~layout(&l2);
  layout::~layout(&l1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f2.
              super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f1.
              super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  lVar2 = 0x88;
  do {
    std::_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::
    ~_Vector_base((_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *
                  )((long)&local_b8._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x18);
  return;
}

Assistant:

test( MultiLineUnboundLayoutProducesGlyphRunsForEachLineUTF8 )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L' ', 0 }, { 0x2713, 1 }, { L'B', 2 }, { 0xE0, 3 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 13, 0 } },
					{ { 17, 0 } },
				};
				factory_ptr f1 = create_single_font_factory(c_fm1, indices, glyphs);
				factory_ptr f2 = create_single_font_factory(c_fm2, indices, glyphs);
				layout::const_iterator gr;

				// INIT / ACT
				layout l1;
				layout l2;

				l1.process(R("\xE2\x9C\x93""B\xC3\xA0 \xC3\xA0""B\xE2\x9C\x93 \xE2\x9C\x93""B\n\xE2\x9C\x93""BB BB\xC3\xA0\n"), limit::none(), *f1);
				l2.process(R("\xE2\x9C\x93""\xC3\xA0 \xC3\xA0""B\n\xE2\x9C\x93 \xE2\x9C\x93""B\n\xE2\x9C\x93""BB BB\xC3\xA0"), limit::none(), *f2);

				// ASSERT
				positioned_glyph reference11[] = {
					{ 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 3, { 17.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 3, { 17.0f, 0.0f } },
						{ 2, { 13.0f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } },
				};
				positioned_glyph reference12[] = {
					{ 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 2, { 13.0f, 0.0f } },
						{ 2, { 13.0f, 0.0f } }, { 3, { 17.0f, 0.0f } }, 
				};

				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 120.2f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference11))
					+ ref_text_line(0.0f, 24.0f, 87.1f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference12)),
					mkvector(l1.begin(), l1.end()));


				positioned_glyph reference21[] = {
					{ 1, { 11.0f, 0.0f } }, { 3, { 17.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 3, { 17.0f, 0.0f } }, { 2, { 13.0f, 0.0f } },
				};
				positioned_glyph reference22[] = {
					{ 1, { 11.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } },
				};
				positioned_glyph reference23[] = {
					{ 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 2, { 13.0f, 0.0f } },
						{ 2, { 13.0f, 0.0f } }, { 3, { 17.0f, 0.0f } },
				};

				assert_equal(plural
					+ ref_text_line(0.0f, 14.0f, 65.1f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference21))
					+ ref_text_line(0.0f, 32.0f, 42.1f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference22))
					+ ref_text_line(0.0f, 50.0f, 87.1f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference23)),
					mkvector(l2.begin(), l2.end()));
			}